

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_string.c
# Opt level: O1

int mpt_object_set_string(mpt_object *obj,char *name,char *val,char *sep)

{
  int iVar1;
  wrapIter it;
  mpt_convertable local_30;
  long *local_28;
  char *local_20;
  char *local_18;
  
  local_30._vptr = &mpt_object_set_string::ctl;
  local_28 = (long *)0x0;
  local_20 = val;
  local_18 = sep;
  iVar1 = (*obj->_vptr->set_property)(obj,name,&local_30);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return iVar1;
}

Assistant:

extern int mpt_object_set_string(MPT_INTERFACE(object) *obj, const char *name, const char *val, const char *sep)
{
	static const MPT_INTERFACE_VPTR(convertable) ctl = {
		iterConv
	};
	MPT_INTERFACE(metatype) *src;
	struct wrapIter it;
	int ret;
	
	it._ctl._vptr = &ctl;
	it.src = 0;
	it.val = val;
	it.sep = sep;
	ret = obj->_vptr->set_property(obj, name, &it._ctl);
	if ((src = it.src)) {
		src->_vptr->unref(src);
	}
	return ret;
}